

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

void rtreeCheckMapping(RtreeCheck *pCheck,int bLeaf,i64 iKey,i64 iVal)

{
  int iVar1;
  sqlite3_stmt *psVar2;
  RtreeCheck *in_RCX;
  undefined8 in_RDX;
  int in_ESI;
  RtreeCheck *in_RDI;
  char *pcVar3;
  long in_FS_OFFSET;
  i64 ii;
  sqlite3_stmt *pStmt;
  int rc;
  char *azSql [2];
  RtreeCheck *in_stack_ffffffffffffffa8;
  RtreeCheck *in_stack_ffffffffffffffb0;
  undefined4 in_stack_ffffffffffffffc0;
  undefined4 uVar4;
  undefined4 in_stack_ffffffffffffffd8;
  char *local_18 [2];
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  uVar4 = 0xaaaaaaaa;
  local_18[0] = "SELECT parentnode FROM %Q.\'%q_parent\' WHERE nodeno=?1";
  local_18[1] = "SELECT nodeno FROM %Q.\'%q_rowid\' WHERE rowid=?1";
  if (in_RDI->aCheckMapping[in_ESI] == (sqlite3_stmt *)0x0) {
    psVar2 = rtreeCheckPrepare(in_RDI,local_18[in_ESI],in_RDI->zDb,in_RDI->zTab);
    in_RDI->aCheckMapping[in_ESI] = psVar2;
  }
  if (in_RDI->rc == 0) {
    sqlite3_bind_int64((sqlite3_stmt *)CONCAT44(uVar4,in_stack_ffffffffffffffc0),
                       (int)((ulong)in_RDI->aCheckMapping[in_ESI] >> 0x20),
                       (sqlite_int64)in_stack_ffffffffffffffb0);
    iVar1 = sqlite3_step((sqlite3_stmt *)CONCAT44(in_ESI,in_stack_ffffffffffffffd8));
    if (iVar1 == 0x65) {
      pcVar3 = "%_parent";
      if (in_ESI != 0) {
        pcVar3 = "%_rowid";
      }
      rtreeCheckAppendMsg(in_RDI,"Mapping (%lld -> %lld) missing from %s table",in_RDX,in_RCX,pcVar3
                         );
    }
    else if ((iVar1 == 100) &&
            (in_stack_ffffffffffffffb0 =
                  (RtreeCheck *)
                  sqlite3_column_int64
                            ((sqlite3_stmt *)in_stack_ffffffffffffffb0,
                             (int)((ulong)in_stack_ffffffffffffffa8 >> 0x20)),
            in_stack_ffffffffffffffb0 != in_RCX)) {
      pcVar3 = "%_parent";
      if (in_ESI != 0) {
        pcVar3 = "%_rowid";
      }
      rtreeCheckAppendMsg(in_RDI,"Found (%lld -> %lld) in %s table, expected (%lld -> %lld)",in_RDX,
                          in_stack_ffffffffffffffb0,pcVar3,in_RDX);
      in_stack_ffffffffffffffa8 = in_RCX;
    }
    rtreeCheckReset(in_stack_ffffffffffffffb0,(sqlite3_stmt *)in_stack_ffffffffffffffa8);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

static void rtreeCheckMapping(
  RtreeCheck *pCheck,             /* RtreeCheck object */
  int bLeaf,                      /* True for a leaf cell, false for interior */
  i64 iKey,                       /* Key for mapping */
  i64 iVal                        /* Expected value for mapping */
){
  int rc;
  sqlite3_stmt *pStmt;
  const char *azSql[2] = {
    "SELECT parentnode FROM %Q.'%q_parent' WHERE nodeno=?1",
    "SELECT nodeno FROM %Q.'%q_rowid' WHERE rowid=?1"
  };

  assert( bLeaf==0 || bLeaf==1 );
  if( pCheck->aCheckMapping[bLeaf]==0 ){
    pCheck->aCheckMapping[bLeaf] = rtreeCheckPrepare(pCheck,
        azSql[bLeaf], pCheck->zDb, pCheck->zTab
    );
  }
  if( pCheck->rc!=SQLITE_OK ) return;

  pStmt = pCheck->aCheckMapping[bLeaf];
  sqlite3_bind_int64(pStmt, 1, iKey);
  rc = sqlite3_step(pStmt);
  if( rc==SQLITE_DONE ){
    rtreeCheckAppendMsg(pCheck, "Mapping (%lld -> %lld) missing from %s table",
        iKey, iVal, (bLeaf ? "%_rowid" : "%_parent")
    );
  }else if( rc==SQLITE_ROW ){
    i64 ii = sqlite3_column_int64(pStmt, 0);
    if( ii!=iVal ){
      rtreeCheckAppendMsg(pCheck,
          "Found (%lld -> %lld) in %s table, expected (%lld -> %lld)",
          iKey, ii, (bLeaf ? "%_rowid" : "%_parent"), iKey, iVal
      );
    }
  }
  rtreeCheckReset(pCheck, pStmt);
}